

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  GLFWmonitor **ppGVar6;
  undefined8 *puVar7;
  GLFWwindow *pGVar8;
  GLFWmonitor *monitor;
  char *pcVar9;
  char *pcVar10;
  ulong __nmemb;
  long lVar11;
  ulong uVar12;
  int monitor_count;
  int local_3c;
  ulong local_38;
  
  bVar2 = false;
  bVar4 = 0;
  while( true ) {
    do {
      bVar1 = bVar4;
      iVar5 = getopt(argc,argv,"afhn");
      bVar4 = 1;
    } while (iVar5 == 0x61);
    if (iVar5 != 0x66) break;
    bVar2 = true;
    bVar4 = bVar1;
  }
  if (iVar5 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar5 = glfwInit();
    if (iVar5 != 0) {
      if ((bool)(bVar1 & bVar2)) {
        ppGVar6 = glfwGetMonitors(&local_3c);
        __nmemb = (ulong)local_3c;
        puVar7 = (undefined8 *)calloc(__nmemb,8);
        if (0 < (long)__nmemb) {
          lVar11 = 0;
          do {
            pGVar8 = create_window(ppGVar6[lVar11]);
            puVar7[lVar11] = pGVar8;
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_3c);
        }
      }
      else {
        if (bVar2) {
          monitor = glfwGetPrimaryMonitor();
        }
        else {
          monitor = (GLFWmonitor *)0x0;
        }
        puVar7 = (undefined8 *)calloc(1,8);
        pGVar8 = create_window(monitor);
        *puVar7 = pGVar8;
        __nmemb = 1;
      }
      local_38 = __nmemb;
      uVar3 = __nmemb;
      if (0 < (int)__nmemb) {
        uVar12 = 0;
        do {
          glfwSetKeyCallback((GLFWwindow *)puVar7[uVar12],key_callback);
          glfwSetFramebufferSizeCallback((GLFWwindow *)puVar7[uVar12],framebuffer_size_callback);
          glfwSetWindowSizeCallback((GLFWwindow *)puVar7[uVar12],window_size_callback);
          glfwSetWindowFocusCallback((GLFWwindow *)puVar7[uVar12],window_focus_callback);
          glfwSetWindowIconifyCallback((GLFWwindow *)puVar7[uVar12],window_iconify_callback);
          glfwSetWindowMaximizeCallback((GLFWwindow *)puVar7[uVar12],window_maximize_callback);
          glfwSetWindowRefreshCallback((GLFWwindow *)puVar7[uVar12],window_refresh_callback);
          window_refresh_callback((GLFWwindow *)puVar7[uVar12]);
          iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar12],0x20002);
          pcVar10 = "iconified";
          if (iVar5 == 0) {
            pcVar10 = "restored";
          }
          iVar5 = glfwGetWindowAttrib((GLFWwindow *)puVar7[uVar12],0x20001);
          pcVar9 = "focused";
          if (iVar5 == 0) {
            pcVar9 = "defocused";
          }
          printf("Window is %s and %s\n",pcVar10,pcVar9);
          uVar12 = uVar12 + 1;
          uVar3 = local_38;
        } while ((__nmemb & 0xffffffff) != uVar12);
      }
      do {
        glfwWaitEvents();
        if (0 < (int)uVar3) {
          uVar12 = 0;
          do {
            iVar5 = glfwWindowShouldClose((GLFWwindow *)puVar7[uVar12]);
            if (iVar5 != 0) {
              glfwTerminate();
              goto LAB_00115da6;
            }
            uVar12 = uVar12 + 1;
          } while ((__nmemb & 0xffffffff) != uVar12);
        }
        fflush(_stdout);
      } while( true );
    }
  }
  else {
    if (iVar5 == 0x68) {
      usage();
LAB_00115da6:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    int fullscreen = GLFW_FALSE, all_monitors = GLFW_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GLFW_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowMaximizeCallback(windows[i], window_maximize_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwWaitEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}